

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

upb_EncodeStatus
upb_Encode(upb_Message *msg,upb_MiniTable *l,int options,upb_Arena *arena,char **buf,size_t *size)

{
  upb_EncodeStatus uVar1;
  upb_encstate local_108;
  
  local_108.status = kUpb_EncodeStatus_Ok;
  local_108.depth = 100;
  if (0xffff < (uint)options) {
    local_108.depth = (uint)options >> 0x10;
  }
  local_108.buf = (char *)0x0;
  local_108.ptr = (char *)0x0;
  local_108.limit = (char *)0x0;
  local_108.sorter.entries = (void **)0x0;
  local_108.sorter.size = 0;
  local_108.sorter.cap = 0;
  local_108.arena = arena;
  local_108.options = options;
  uVar1 = upb_Encoder_Encode(&local_108,msg,l,buf,size,false);
  return uVar1;
}

Assistant:

upb_EncodeStatus upb_Encode(const upb_Message* msg, const upb_MiniTable* l,
                            int options, upb_Arena* arena, char** buf,
                            size_t* size) {
  return _upb_Encode(msg, l, options, arena, buf, size, false);
}